

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

int __thiscall
re2::RepetitionWalker::PreVisit(RepetitionWalker *this,Regexp *re,int parent_arg,bool *stop)

{
  RegexpOp RVar1;
  undefined4 local_30;
  undefined4 local_2c;
  int m;
  int arg;
  bool *stop_local;
  int parent_arg_local;
  Regexp *re_local;
  RepetitionWalker *this_local;
  
  RVar1 = Regexp::op(re);
  local_2c = parent_arg;
  if (RVar1 == kRegexpRepeat) {
    local_30 = Regexp::max(re);
    if (local_30 < 0) {
      local_30 = Regexp::min(re);
    }
    if (0 < local_30) {
      local_2c = parent_arg / local_30;
    }
  }
  return local_2c;
}

Assistant:

int RepetitionWalker::PreVisit(Regexp* re, int parent_arg, bool* stop) {
  int arg = parent_arg;
  if (re->op() == kRegexpRepeat) {
    int m = re->max();
    if (m < 0) {
      m = re->min();
    }
    if (m > 0) {
      arg /= m;
    }
  }
  return arg;
}